

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O0

void d68020_cpscc(void)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  uint extension2;
  uint extension1;
  
  if ((g_cpu_type & 0x1c) == 0) {
    if ((g_cpu_ir & 0xf000) == 0xf000) {
      d68000_1111();
    }
    else {
      d68000_illegal();
    }
  }
  else {
    uVar2 = dasm_read_imm_16(2);
    uVar3 = dasm_read_imm_16(2);
    uVar4 = g_cpu_ir >> 9;
    pcVar1 = g_cpcc[uVar2 & 0x3f];
    pcVar5 = get_ea_mode_str(g_cpu_ir,0);
    sprintf(g_dasm_str,"%ds%-4s  %s; (extension = $%x) (2-3)",(ulong)(uVar4 & 7),pcVar1,pcVar5,
            (ulong)uVar3);
  }
  return;
}

Assistant:

static void d68020_cpscc(void)
{
	uint extension1;
	uint extension2;
	LIMIT_CPU_TYPES(M68020_PLUS);
	extension1 = read_imm_16();
	extension2 = read_imm_16();
	sprintf(g_dasm_str, "%ds%-4s  %s; (extension = $%x) (2-3)", (g_cpu_ir>>9)&7, g_cpcc[extension1&0x3f], get_ea_mode_str_8(g_cpu_ir), extension2);
}